

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall mjs::parser::parse_left_hand_side_expression(parser *this)

{
  bool bVar1;
  token_type tVar2;
  parser *in_RCX;
  parser *in_RSI;
  wstring local_140;
  token local_120;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  undefined1 local_e0 [48];
  undefined1 local_b0 [48];
  undefined1 local_80 [8];
  expression_ptr e;
  undefined1 local_50 [64];
  parser *this_local;
  expression_ptr *m;
  
  local_50[0x37] = 0;
  this_local = this;
  parse_member_expression(this);
  while( true ) {
    while( true ) {
      while (tVar2 = current_token_type(in_RSI), tVar2 == lparen) {
        parse_argument_list((expression_list *)local_50,in_RSI);
        in_RCX = (parser *)local_50;
        make_expression<mjs::call_expression,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>>
                  ((parser *)(local_50 + 0x18),
                   (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)in_RSI,
                   (vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                    *)this);
        std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
                  ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this,
                   (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                   (local_50 + 0x18));
        std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                  ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                   (local_50 + 0x18));
        std::
        vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
        ::~vector((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                   *)local_50);
      }
      accept((parser *)&e,(int)in_RSI,(sockaddr *)0x32,(socklen_t *)in_RCX);
      bVar1 = token::operator_cast_to_bool((token *)&e);
      token::~token((token *)&e);
      if (!bVar1) break;
      parse_expression((parser *)local_80);
      expect((token *)(local_b0 + 8),in_RSI,rbracket,"parse_left_hand_side_expression",0x2f3);
      token::~token((token *)(local_b0 + 8));
      local_e0._44_4_ = 0x32;
      in_RCX = this;
      make_expression<mjs::binary_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)local_b0,(token_type *)in_RSI,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                 (local_e0 + 0x2c),
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_b0);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_b0);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_80);
    }
    accept((parser *)local_e0,(int)in_RSI,(sockaddr *)0x25,(socklen_t *)in_RCX);
    bVar1 = token::operator_cast_to_bool((token *)local_e0);
    token::~token((token *)local_e0);
    if (!bVar1) break;
    local_f8._12_4_ = 0x25;
    get_identifier_name_abi_cxx11_(&local_140,in_RSI,"parse_left_hand_side_expression",0x2f6);
    token::token(&local_120,string_literal,&local_140);
    make_expression<mjs::literal_expression,mjs::token>((parser *)local_f8,(token *)in_RSI);
    in_RCX = this;
    make_expression<mjs::binary_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((parser *)local_e8,(token_type *)in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
               (local_f8 + 0xc),
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_e8);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_e8);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_f8);
    token::~token(&local_120);
    std::__cxx11::wstring::~wstring((wstring *)&local_140);
  }
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_left_hand_side_expression() {
        // LeftHandSideExpression :
        //  NewExpression
        //  CallExpression

        // NewExpression :
        //  MemberExpression
        //  new NewExpression

        // CallExpression :
        //  MemberExpression Arguments
        //  CallExpression Arguments
        //  CallExpression [ Expression ]
        //  CallExpression . Identifier (IdentifierName in ES5+)

        // MemberExpression:
        //   PrimaryExpression
        //   MemberExpression [ Expression ]
        //   MemberExpression .  Identifier (IdentifierName in ES5+)
        //   new MemberExpression Arguments

        auto m = parse_member_expression();
        for (;;) {
            if (current_token_type() == token_type::lparen) {
                m = make_expression<call_expression>(std::move(m), parse_argument_list());
            } else if (accept(token_type::lbracket)) {
                auto e = parse_expression();
                EXPECT(token_type::rbracket);
                m = make_expression<binary_expression>(token_type::lbracket, std::move(m), std::move(e));
            } else if (accept(token_type::dot)) {
                m = make_expression<binary_expression>(token_type::dot, std::move(m), make_expression<literal_expression>(token{token_type::string_literal, get_identifier_name(__func__, __LINE__)}));
            } else {
                return m;
            }
        }
    }